

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O0

Color plot::operator*(Color *lhs,float *rhs)

{
  float fVar1;
  float *rhs_local;
  Color *lhs_local;
  
  fVar1 = *rhs;
  Color::Color((Color *)&lhs_local,lhs->r * fVar1,lhs->g * fVar1,lhs->b * fVar1,lhs->a * fVar1);
  return _lhs_local;
}

Assistant:

inline constexpr Color operator*(Color const& lhs, float const& rhs) {
    return {
        lhs.r*rhs,
        lhs.g*rhs,
        lhs.b*rhs,
        lhs.a*rhs
    };
}